

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgAcceleratedDataStructures.hpp
# Opt level: O3

GpuVector<double> * __thiscall
TasGrid::GpuVector<double>::operator=(GpuVector<double> *this,GpuVector<double> *other)

{
  size_t sVar1;
  double *pdVar2;
  GpuVector<double> local_18;
  
  sVar1 = other->num_entries;
  pdVar2 = other->gpu_data;
  other->num_entries = 0;
  other->gpu_data = (double *)0x0;
  local_18.num_entries = this->num_entries;
  this->num_entries = sVar1;
  local_18.gpu_data = this->gpu_data;
  this->gpu_data = pdVar2;
  clear(&local_18);
  return this;
}

Assistant:

GpuVector<T>& operator =(GpuVector<T> &&other){
        GpuVector<T> temp(std::move(other));
        std::swap(num_entries, temp.num_entries);
        std::swap(gpu_data, temp.gpu_data);
        #ifdef Tasmanian_ENABLE_DPCPP
        std::swap(sycl_queue, temp.sycl_queue);
        #endif
        return *this;
    }